

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_mac_metadata_blob
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  archive_read *a_00;
  int64_t iVar1;
  void *pvVar2;
  archive_entry *in_RCX;
  archive_entry *in_RDX;
  archive_read *in_RSI;
  ulong *in_R8;
  wchar_t *wname;
  wchar_t *wp;
  char *name;
  char *p;
  void *data;
  int64_t size;
  archive_entry *in_stack_ffffffffffffff98;
  archive_read *local_58;
  char *local_50;
  char *local_48;
  wchar_t local_4;
  
  a_00 = (archive_read *)archive_entry_pathname_w(in_stack_ffffffffffffff98);
  local_58 = a_00;
  if (a_00 == (archive_read *)0x0) {
    local_50 = archive_entry_pathname(in_stack_ffffffffffffff98);
    local_48 = local_50;
    if (local_50 == (char *)0x0) {
      return L'\xffffffe7';
    }
    for (; *local_48 != '\0'; local_48 = local_48 + 1) {
      if ((*local_48 == '/') && (local_48[1] != '\0')) {
        local_50 = local_48 + 1;
      }
    }
    if (((*local_50 != '.') || (local_50[1] != '_')) || (local_50[2] == '\0')) {
      return L'\0';
    }
  }
  else {
    for (; (local_58->archive).magic != L'\0'; local_58 = (archive_read *)&(local_58->archive).state
        ) {
      if (((local_58->archive).magic == L'/') && ((local_58->archive).state != 0)) {
        a_00 = (archive_read *)&(local_58->archive).state;
      }
    }
    if ((((a_00->archive).magic != L'.') || ((a_00->archive).state != 0x5f)) ||
       (*(int *)&(a_00->archive).vtable == 0)) {
      return L'\0';
    }
  }
  iVar1 = archive_entry_size(in_RDX);
  pvVar2 = __archive_read_ahead(a_00,(size_t)in_stack_ffffffffffffff98,(ssize_t *)0x2740e9);
  if (pvVar2 == (void *)0x0) {
    *in_R8 = 0;
    local_4 = L'\xffffffe2';
  }
  else {
    archive_entry_copy_mac_metadata((archive_entry *)a_00,in_stack_ffffffffffffff98,0x274120);
    *in_R8 = iVar1 + 0x1ffU & 0xfffffffffffffe00;
    tar_flush_unconsumed(a_00,(size_t *)in_stack_ffffffffffffff98);
    local_4 = tar_read_header(in_RSI,(tar *)in_RDX,in_RCX,in_R8);
  }
  return local_4;
}

Assistant:

static int
read_mac_metadata_blob(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int64_t size;
	const void *data;
	const char *p, *name;
	const wchar_t *wp, *wname;

	(void)h; /* UNUSED */

	wname = wp = archive_entry_pathname_w(entry);
	if (wp != NULL) {
		/* Find the last path element. */
		for (; *wp != L'\0'; ++wp) {
			if (wp[0] == '/' && wp[1] != L'\0')
				wname = wp + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (wname[0] != L'.' || wname[1] != L'_' || wname[2] == L'\0')
			return ARCHIVE_OK;
	} else {
		/* Find the last path element. */
		name = p = archive_entry_pathname(entry);
		if (p == NULL)
			return (ARCHIVE_FAILED);
		for (; *p != '\0'; ++p) {
			if (p[0] == '/' && p[1] != '\0')
				name = p + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (name[0] != '.' || name[1] != '_' || name[2] == '\0')
			return ARCHIVE_OK;
	}

 	/* Read the body as a Mac OS metadata blob. */
	size = archive_entry_size(entry);

	/*
	 * TODO: Look beyond the body here to peek at the next header.
	 * If it's a regular header (not an extension header)
	 * that has the wrong name, just return the current
	 * entry as-is, without consuming the body here.
	 * That would reduce the risk of us mis-identifying
	 * an ordinary file that just happened to have
	 * a name starting with "._".
	 *
	 * Q: Is the above idea really possible?  Even
	 * when there are GNU or pax extension entries?
	 */
	data = __archive_read_ahead(a, (size_t)size, NULL);
	if (data == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	archive_entry_copy_mac_metadata(entry, data, (size_t)size);
	*unconsumed = (size_t)((size + 511) & ~ 511);
	tar_flush_unconsumed(a, unconsumed);
	return (tar_read_header(a, tar, entry, unconsumed));
}